

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

string * DirUtils::GetLastPath(string *__return_storage_ptr__,string *p)

{
  pointer pcVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  pcVar1 = (p->_M_dataplus)._M_p;
  uVar2 = p->_M_string_length;
  uVar4 = uVar2 & 0xffffffff;
  do {
    if ((int)uVar4 < 1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + uVar2);
      return __return_storage_ptr__;
    }
    lVar3 = uVar4 - 1;
    uVar4 = uVar4 - 1;
  } while (pcVar1[lVar3] != '/');
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)p);
  return __return_storage_ptr__;
}

Assistant:

string DirUtils::GetLastPath(const string& p){
	int l = p.length();
	for(int i = l - 1; i >= 0; i--){
		if(p[i] == '/')
			return p.substr(i + 1, l - i - 1);
	}
	return p;
}